

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BasicVariousTessLevelsPosAttrCase::iterate
          (BasicVariousTessLevelsPosAttrCase *this)

{
  glUniform1fFunc p_Var1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  GLint GVar5;
  GLenum err;
  TestLog *this_00;
  undefined4 extraout_var;
  char *str;
  ShaderProgram *this_01;
  Functions *gl_00;
  MessageBuilder *pMVar6;
  size_type sVar7;
  reference this_02;
  float *data;
  RenderContext *context;
  Archive *archive;
  TessPrimitiveType primType;
  ConstPixelBufferAccess *result;
  VertexArrayBinding *local_4d8;
  float local_448;
  float local_444;
  ConstPixelBufferAccess local_428;
  ConstPixelBufferAccess local_400;
  undefined1 local_3d1;
  undefined1 local_3d0 [7];
  bool success;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  undefined1 local_350 [8];
  TextureLevel reference;
  Surface rendered;
  allocator<char> local_2f1;
  string local_2f0;
  undefined1 *local_2d0;
  undefined1 local_2c8 [8];
  VertexArrayBinding attrBindings [1];
  Vector<float,_2> local_270;
  Vector<float,_2> local_268;
  Vector<float,_2> local_260;
  Vector<float,_2> local_258;
  Vector<float,_2> local_250;
  Vector<float,_2> local_248;
  Vector<float,_2> local_240;
  undefined1 local_238 [8];
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> positions;
  MessageBuilder local_1f0;
  int local_70;
  int local_6c;
  int i_1;
  int i;
  float outerLevels [4];
  float innerLevels [2];
  int tessLevelCaseNdx;
  int patchSize;
  Functions *gl;
  undefined1 local_38 [4];
  deUint32 programGL;
  RandomViewport viewport;
  RenderContext *renderCtx;
  TestLog *log;
  BasicVariousTessLevelsPosAttrCase *this_local;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  viewport._8_8_ = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*((RenderContext *)viewport._8_8_)->_vptr_RenderContext[4])();
  str = tcu::TestNode::getName((TestNode *)this);
  dVar4 = deStringHash(str);
  result = (ConstPixelBufferAccess *)(ulong)dVar4;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)local_38,(RenderTarget *)CONCAT44(extraout_var,iVar3),0x100,0x100,
             dVar4);
  this_01 = de::SharedPtr<const_glu::ShaderProgram>::operator->(&this->m_program);
  dVar4 = glu::ShaderProgram::getProgram(this_01);
  gl_00 = (Functions *)(**(code **)(*(long *)viewport._8_8_ + 0x18))();
  if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    local_444 = 4.2039e-45;
  }
  else {
    if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
      local_448 = 5.60519e-45;
    }
    else {
      local_448 = -NAN;
      if (this->m_primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
        local_448 = 5.60519e-45;
      }
    }
    local_444 = local_448;
  }
  innerLevels[1] = local_444;
  setViewport(gl_00,(RandomViewport *)local_38);
  (*gl_00->clearColor)(0.0,0.0,0.0,1.0);
  (*gl_00->useProgram)(dVar4);
  (*gl_00->patchParameteri)(0x8e72,(GLint)innerLevels[1]);
  innerLevels[0] = 0.0;
  while( true ) {
    if (2 < (int)innerLevels[0]) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
    for (local_6c = 0; local_6c < 2; local_6c = local_6c + 1) {
      iVar3 = getClampedRoundedTessLevel
                        (this->m_spacing,
                         iterate::tessLevelCases[(int)innerLevels[0]].inner[local_6c]);
      outerLevels[(long)local_6c + 2] = (float)iVar3;
    }
    for (local_70 = 0; primType = (TessPrimitiveType)result, local_70 < 4; local_70 = local_70 + 1)
    {
      iVar3 = getClampedRoundedTessLevel
                        (this->m_spacing,
                         *(float *)((long)(int)innerLevels[0] * 0x18 + 0x2bf4cb8 +
                                   (long)local_70 * 4));
      (&i_1)[local_70] = (int)(float)iVar3;
    }
    tcu::TestLog::operator<<(&local_1f0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_1f0,(char (*) [22])"Tessellation levels: ");
    Functional::(anonymous_namespace)::tessellationLevelsString_abi_cxx11_
              ((string *)
               &positions.
                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (_anonymous_namespace_ *)(outerLevels + 2),(float *)&i_1,
               (float *)(ulong)this->m_primitiveType,primType);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &positions.
                                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string
              ((string *)
               &positions.
                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    tcu::MessageBuilder::~MessageBuilder(&local_1f0);
    p_Var1 = gl_00->uniform1f;
    GVar5 = (*gl_00->getUniformLocation)(dVar4,"u_tessLevelInner0");
    (*p_Var1)(GVar5,outerLevels[2]);
    p_Var1 = gl_00->uniform1f;
    GVar5 = (*gl_00->getUniformLocation)(dVar4,"u_tessLevelInner1");
    (*p_Var1)(GVar5,outerLevels[3]);
    p_Var1 = gl_00->uniform1f;
    GVar5 = (*gl_00->getUniformLocation)(dVar4,"u_tessLevelOuter0");
    (*p_Var1)(GVar5,(GLfloat)i_1);
    p_Var1 = gl_00->uniform1f;
    GVar5 = (*gl_00->getUniformLocation)(dVar4,"u_tessLevelOuter1");
    (*p_Var1)(GVar5,(GLfloat)i);
    p_Var1 = gl_00->uniform1f;
    GVar5 = (*gl_00->getUniformLocation)(dVar4,"u_tessLevelOuter2");
    (*p_Var1)(GVar5,outerLevels[0]);
    p_Var1 = gl_00->uniform1f;
    GVar5 = (*gl_00->getUniformLocation)(dVar4,"u_tessLevelOuter3");
    (*p_Var1)(GVar5,outerLevels[1]);
    (*gl_00->clear)(0x4000);
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
              ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_238);
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::reserve
              ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_238,4
              );
    if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
      tcu::Vector<float,_2>::Vector(&local_240,0.8,0.6);
      std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
                ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_238
                 ,&local_240);
      tcu::Vector<float,_2>::Vector(&local_248,0.0,-0.786);
      std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
                ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_238
                 ,&local_248);
      tcu::Vector<float,_2>::Vector(&local_250,-0.8,0.6);
      std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
                ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_238
                 ,&local_250);
    }
    else if ((this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) ||
            (this->m_primitiveType == TESSPRIMITIVETYPE_ISOLINES)) {
      tcu::Vector<float,_2>::Vector(&local_258,-0.8,-0.8);
      std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
                ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_238
                 ,&local_258);
      tcu::Vector<float,_2>::Vector(&local_260,0.8,-0.8);
      std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
                ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_238
                 ,&local_260);
      tcu::Vector<float,_2>::Vector(&local_268,-0.8,0.8);
      std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
                ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_238
                 ,&local_268);
      tcu::Vector<float,_2>::Vector(&local_270,0.8,0.8);
      std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
                ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_238
                 ,&local_270);
    }
    local_2d0 = local_2c8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,"in_v_position",&local_2f1);
    sVar7 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                      ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                       local_238);
    this_02 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
              operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                         local_238,0);
    data = tcu::Vector<float,_2>::x(this_02);
    glu::va::Float((VertexArrayBinding *)local_2c8,&local_2f0,2,(int)sVar7,0,data);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator(&local_2f1);
    context = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    glu::pr::Patches((PrimitiveList *)&rendered.m_pixels.m_cap,(int)innerLevels[1]);
    glu::draw(context,dVar4,1,(VertexArrayBinding *)local_2c8,
              (PrimitiveList *)&rendered.m_pixels.m_cap,(DrawUtilCallback *)0x0);
    err = (*gl_00->getError)();
    glu::checkError(err,"Draw failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                    ,0x98d);
    local_4d8 = (VertexArrayBinding *)&attrBindings[0].pointer.data;
    do {
      local_4d8 = local_4d8 + -1;
      glu::VertexArrayBinding::~VertexArrayBinding(local_4d8);
    } while (local_4d8 != (VertexArrayBinding *)local_2c8);
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
              ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_238);
    getPixels((Surface *)&reference.m_data.m_cap,(RenderContext *)viewport._8_8_,
              (RandomViewport *)local_38);
    archive = tcu::TestContext::getArchive
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::operator+(&local_3b0,&this->m_referenceImagePathPrefix,"_");
    de::toString<int>((string *)local_3d0,(int *)innerLevels);
    std::operator+(&local_390,&local_3b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0);
    std::operator+(&local_370,&local_390,".png");
    getPNG((TextureLevel *)local_350,archive,&local_370);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)local_3d0);
    std::__cxx11::string::~string((string *)&local_3b0);
    tcu::TextureLevel::getAccess(&local_400,(TextureLevel *)local_350);
    tcu::Surface::getAccess(&local_428,(Surface *)&reference.m_data.m_cap);
    result = &local_428;
    bVar2 = tcu::fuzzyCompare(this_00,"ImageComparison","Image Comparison",&local_400,result,0.002,
                              COMPARE_LOG_RESULT);
    local_3d1 = bVar2;
    if (!bVar2) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Image comparison failed");
      this_local._4_4_ = STOP;
    }
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_350);
    tcu::Surface::~Surface((Surface *)&reference.m_data.m_cap);
    if (!bVar2) break;
    innerLevels[0] = (float)((int)innerLevels[0] + 1);
  }
  return this_local._4_4_;
}

Assistant:

BasicVariousTessLevelsPosAttrCase::IterateResult BasicVariousTessLevelsPosAttrCase::iterate (void)
{
	static const struct
	{
		float inner[2];
		float outer[4];
	} tessLevelCases[] =
	{
		{ { 9.0f,	9.0f	},	{ 9.0f,		9.0f,	9.0f,	9.0f	} },
		{ { 8.0f,	11.0f	},	{ 13.0f,	15.0f,	18.0f,	21.0f	} },
		{ { 17.0f,	14.0f	},	{ 3.0f,		6.0f,	9.0f,	12.0f	} }
	};

	TestLog&				log					= m_testCtx.getLog();
	const RenderContext&	renderCtx			= m_context.getRenderContext();
	const RandomViewport	viewport			(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const deUint32			programGL			= m_program->getProgram();
	const glw::Functions&	gl					= renderCtx.getFunctions();
	const int				patchSize			= m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES	? 3
												: m_primitiveType == TESSPRIMITIVETYPE_QUADS		? 4
												: m_primitiveType == TESSPRIMITIVETYPE_ISOLINES		? 4
												: -1;

	setViewport(gl, viewport);
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.useProgram(programGL);

	gl.patchParameteri(GL_PATCH_VERTICES, patchSize);

	for (int tessLevelCaseNdx = 0; tessLevelCaseNdx < DE_LENGTH_OF_ARRAY(tessLevelCases); tessLevelCaseNdx++)
	{
		float innerLevels[2];
		float outerLevels[4];

		for (int i = 0; i < DE_LENGTH_OF_ARRAY(innerLevels); i++)
			innerLevels[i] = (float)getClampedRoundedTessLevel(m_spacing, tessLevelCases[tessLevelCaseNdx].inner[i]);

		for (int i = 0; i < DE_LENGTH_OF_ARRAY(outerLevels); i++)
			outerLevels[i] = (float)getClampedRoundedTessLevel(m_spacing, tessLevelCases[tessLevelCaseNdx].outer[i]);

		log << TestLog::Message << "Tessellation levels: " << tessellationLevelsString(&innerLevels[0], &outerLevels[0], m_primitiveType) << TestLog::EndMessage;

		gl.uniform1f(gl.getUniformLocation(programGL, "u_tessLevelInner0"), innerLevels[0]);
		gl.uniform1f(gl.getUniformLocation(programGL, "u_tessLevelInner1"), innerLevels[1]);
		gl.uniform1f(gl.getUniformLocation(programGL, "u_tessLevelOuter0"), outerLevels[0]);
		gl.uniform1f(gl.getUniformLocation(programGL, "u_tessLevelOuter1"), outerLevels[1]);
		gl.uniform1f(gl.getUniformLocation(programGL, "u_tessLevelOuter2"), outerLevels[2]);
		gl.uniform1f(gl.getUniformLocation(programGL, "u_tessLevelOuter3"), outerLevels[3]);

		gl.clear(GL_COLOR_BUFFER_BIT);

		{
			vector<Vec2> positions;
			positions.reserve(4);

			if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
			{
				positions.push_back(Vec2( 0.8f,    0.6f));
				positions.push_back(Vec2( 0.0f, -0.786f));
				positions.push_back(Vec2(-0.8f,    0.6f));
			}
			else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS || m_primitiveType == TESSPRIMITIVETYPE_ISOLINES)
			{
				positions.push_back(Vec2(-0.8f, -0.8f));
				positions.push_back(Vec2( 0.8f, -0.8f));
				positions.push_back(Vec2(-0.8f,  0.8f));
				positions.push_back(Vec2( 0.8f,  0.8f));
			}
			else
				DE_ASSERT(false);

			DE_ASSERT((int)positions.size() == patchSize);

			const glu::VertexArrayBinding attrBindings[] =
			{
				glu::va::Float("in_v_position", 2, (int)positions.size(), 0, &positions[0].x())
			};

			glu::draw(m_context.getRenderContext(), programGL, DE_LENGTH_OF_ARRAY(attrBindings), &attrBindings[0],
				glu::pr::Patches(patchSize));
			GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");
		}

		{
			const tcu::Surface			rendered	= getPixels(renderCtx, viewport);
			const tcu::TextureLevel		reference	= getPNG(m_testCtx.getArchive(), m_referenceImagePathPrefix + "_" + de::toString(tessLevelCaseNdx) + ".png");
			const bool					success		= tcu::fuzzyCompare(log, "ImageComparison", "Image Comparison", reference.getAccess(), rendered.getAccess(), 0.002f, tcu::COMPARE_LOG_RESULT);

			if (!success)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
				return STOP;
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}